

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O2

void armci_stride_info_init
               (stride_info_t *sinfo,void *base_ptr,int stride_levels,int *stride_arr,int *seg_count
               )

{
  uint __line;
  int iVar1;
  ulong uVar2;
  long lVar3;
  char *__assertion;
  ulong uVar4;
  
  if (sinfo == (stride_info_t *)0x0) {
    __assertion = "sinfo!=NULL";
    __line = 0x21;
  }
  else if (stride_levels < 0) {
    __assertion = "stride_levels>=0";
    __line = 0x22;
  }
  else if ((uint)stride_levels < 9) {
    for (uVar4 = 0; (uint)stride_levels != uVar4; uVar4 = uVar4 + 1) {
      if (uVar4 == 0) {
        if (*stride_arr < *seg_count) {
          __assertion = "stride_arr[0] >= seg_count[0]";
          __line = 0x26;
          goto LAB_001b7f66;
        }
      }
      else if (stride_arr[uVar4] < seg_count[uVar4] * stride_arr[uVar4 - 1]) {
        __assertion = "stride_arr[i] >= stride_arr[i-1]*seg_count[i]";
        __line = 0x28;
        goto LAB_001b7f66;
      }
    }
    sinfo->base_ptr = (char *)base_ptr;
    sinfo->stride_levels = stride_levels;
    for (uVar4 = 0; (uint)stride_levels != uVar4; uVar4 = uVar4 + 1) {
      sinfo->stride_arr[uVar4] = stride_arr[uVar4];
    }
    uVar2 = (ulong)(stride_levels + 1);
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      sinfo->seg_count[uVar4] = seg_count[uVar4];
    }
    sinfo->size = 1;
    iVar1 = 1;
    for (lVar3 = 0; uVar2 - 1 != lVar3; lVar3 = lVar3 + 1) {
      iVar1 = iVar1 * sinfo->seg_count[lVar3 + 1];
      sinfo->size = iVar1;
    }
    if (0 < iVar1) {
      sinfo->pos = 0;
      for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
        sinfo->itr[uVar4] = 0;
      }
      return;
    }
    __assertion = "sinfo->size>0";
    __line = 0x37;
  }
  else {
    __assertion = "stride_levels<=ARMCI_MAX_STRIDE_LEVEL";
    __line = 0x23;
  }
LAB_001b7f66:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                ,__line,
                "void armci_stride_info_init(stride_info_t *, void *, int, const int *, const int *)"
               );
}

Assistant:

void armci_stride_info_init(stride_info_t *sinfo,
			    void *base_ptr,
			    int stride_levels,
			    const int *stride_arr,
			    const int *seg_count) {
  int i;
  assert(sinfo!=NULL);
  assert(stride_levels>=0);
  assert(stride_levels<=ARMCI_MAX_STRIDE_LEVEL);
  for(i=0; i<stride_levels; i++) {
    if(i==0) 
      assert(stride_arr[0] >= seg_count[0]);
    else 
      assert(stride_arr[i] >= stride_arr[i-1]*seg_count[i]);
  }

  sinfo->base_ptr= base_ptr;
  sinfo->stride_levels = stride_levels;
  for(i=0; i<stride_levels; i++) {
    sinfo->stride_arr[i] = stride_arr[i];
  }
  for(i=0; i<stride_levels+1; i++) {
    sinfo->seg_count[i] = seg_count[i];
  }
  sinfo->size=1;
  for(i=1; i<stride_levels+1; i++) {
    sinfo->size *= sinfo->seg_count[i];
  }
  assert(sinfo->size>0);
  sinfo->pos=0;
  for(i=0; i<stride_levels+1; i++) {
    sinfo->itr[i] = 0;
  }
}